

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ImGuiWindow *pIVar5;
  undefined8 uVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  ImGuiID IVar10;
  ImGuiTabItemFlags IVar11;
  int iVar12;
  int iVar13;
  ImGuiID IVar14;
  ImGuiTabItemFlags IVar15;
  int iVar16;
  ImGuiTabItem *pIVar17;
  uint uVar18;
  long lVar19;
  ImGuiTabItem *tab;
  ImGuiTabItem item_tmp;
  undefined5 uStack_2d;
  undefined3 local_28;
  undefined5 uStack_25;
  undefined3 uStack_20;
  
  if (tab_bar->ReorderRequestTabId == 0) {
    return false;
  }
  lVar19 = (long)(tab_bar->Tabs).Size;
  if (0 < lVar19) {
    tab = (tab_bar->Tabs).Data;
    do {
      if (tab->ID == tab_bar->ReorderRequestTabId) {
        if ((tab->Flags & 0x20) != 0) {
          return false;
        }
        iVar16 = ImGuiTabBar::GetTabOrder(tab_bar,tab);
        uVar18 = tab_bar->ReorderRequestDir + iVar16;
        if ((int)uVar18 < 0) {
          return false;
        }
        if ((tab_bar->Tabs).Size <= (int)uVar18) {
          return false;
        }
        pIVar17 = (tab_bar->Tabs).Data;
        uVar1 = pIVar17[uVar18].Flags;
        if ((uVar1 & 0x20) != 0) {
          return false;
        }
        if (((uVar1 ^ tab->Flags) & 0xc0) != 0) {
          return false;
        }
        pIVar17 = pIVar17 + uVar18;
        IVar14 = tab->ID;
        IVar15 = tab->Flags;
        pIVar2 = tab->Window;
        iVar12 = tab->LastFrameVisible;
        iVar13 = tab->LastFrameSelected;
        uVar3._0_4_ = tab->Offset;
        uVar3._4_4_ = tab->Width;
        uVar6._0_4_ = tab->ContentWidth;
        uVar6._4_2_ = tab->NameOffset;
        uVar6._6_2_ = tab->BeginOrder;
        uVar4._0_2_ = tab->IndexDuringLayout;
        uVar4._2_1_ = tab->WantClose;
        uVar4._3_5_ = *(undefined5 *)&tab->field_0x2b;
        local_28 = (undefined3)(undefined4)uVar6;
        uStack_25 = (undefined5)((ulong)uVar6 >> 0x18);
        uStack_20 = (undefined3)uVar4;
        uStack_2d = (undefined5)((ulong)uVar3 >> 0x18);
        IVar10 = pIVar17->ID;
        IVar11 = pIVar17->Flags;
        pIVar5 = pIVar17->Window;
        iVar16 = pIVar17->LastFrameVisible;
        iVar7 = pIVar17->LastFrameSelected;
        fVar8 = pIVar17->Offset;
        fVar9 = pIVar17->Width;
        uVar6 = *(undefined8 *)((long)&pIVar17->ContentWidth + 3);
        *(undefined8 *)((long)&tab->Offset + 3) = *(undefined8 *)((long)&pIVar17->Offset + 3);
        *(undefined8 *)((long)&tab->ContentWidth + 3) = uVar6;
        tab->LastFrameVisible = iVar16;
        tab->LastFrameSelected = iVar7;
        tab->Offset = fVar8;
        tab->Width = fVar9;
        tab->ID = IVar10;
        tab->Flags = IVar11;
        tab->Window = pIVar5;
        *(ulong *)((long)&pIVar17->Offset + 3) = CONCAT35(local_28,uStack_2d);
        *(ulong *)((long)&pIVar17->ContentWidth + 3) = CONCAT35(uStack_20,uStack_25);
        pIVar17->LastFrameVisible = iVar12;
        pIVar17->LastFrameSelected = iVar13;
        pIVar17->Offset = (float)(undefined4)uVar3;
        pIVar17->Width = (float)uVar3._4_4_;
        pIVar17->ID = IVar14;
        pIVar17->Flags = IVar15;
        pIVar17->Window = pIVar2;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
      tab = tab + 1;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered TabItem must share the same position flags than target
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (tab2->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    *tab1 = *tab2;
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}